

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_token_from_bytes
              (uchar *entropy,size_t entropy_len,uchar *bytes,size_t bytes_len,uchar *bytes_out,
              size_t len)

{
  uchar local_88 [4];
  int ret;
  uchar buff [64];
  size_t len_local;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t entropy_len_local;
  uchar *entropy_local;
  
  if ((((entropy == (uchar *)0x0) || (entropy_len != 0x20)) || (bytes_len == 0)) ||
     (((bytes_len != 0x20 || (bytes_out == (uchar *)0x0)) || (len != 0x20)))) {
    entropy_local._4_4_ = -2;
  }
  else {
    memcpy(local_88,entropy,0x20);
    memcpy(buff + 0x18,bytes,0x20);
    entropy_local._4_4_ = wally_sha256_midstate(local_88,0x40,bytes_out,0x20);
    wally_clear(local_88,0x40);
  }
  return entropy_local._4_4_;
}

Assistant:

static int tx_elements_token_from_bytes(const unsigned char *entropy,
                                        size_t entropy_len,
                                        const unsigned char *bytes,
                                        size_t bytes_len,
                                        unsigned char *bytes_out,
                                        size_t len)
{
    unsigned char buff[2 * SHA256_LEN];
    int ret;

    if (!entropy || entropy_len != SHA256_LEN ||
        !bytes_len || bytes_len != SHA256_LEN ||
        !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    memcpy(buff, entropy, entropy_len);
    memcpy(buff + SHA256_LEN, bytes, bytes_len);

    ret = wally_sha256_midstate(buff, sizeof(buff), bytes_out, len);
    wally_clear(buff, sizeof(buff));

    return ret;
}